

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_init_ppc64(CPUState *cpu)

{
  undefined4 *puVar1;
  void *pvVar2;
  long lVar3;
  void *__s;
  gpointer pvVar4;
  undefined8 *puVar5;
  long lVar6;
  timeval tv;
  timeval local_38;
  
  pvVar2 = cpu->env_ptr;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  *(undefined2 *)((long)pvVar2 + -0x1c00) = 0;
  puVar5 = (undefined8 *)((long)pvVar2 + -0xa8);
  lVar6 = -0x1be0;
  do {
    puVar1 = (undefined4 *)((long)pvVar2 + lVar6);
    *(__suseconds_t *)(puVar1 + 4) = local_38.tv_usec * 1000 + local_38.tv_sec * 1000000000;
    *(undefined1 (*) [16])(puVar1 + 6) = (undefined1  [16])0x0;
    puVar5[-1] = 0x3fc0;
    pvVar4 = g_malloc(0x4000);
    *puVar5 = pvVar4;
    pvVar4 = g_malloc(0x1000);
    *(gpointer *)(puVar1 + 0xac) = pvVar4;
    lVar3 = puVar5[-1];
    __s = (void *)*puVar5;
    *(undefined1 (*) [16])(puVar1 + 8) = (undefined1  [16])0x0;
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    memset(__s,0xff,lVar3 + 0x40);
    memset(puVar1 + 0xc,0xff,0x200);
    puVar5 = puVar5 + 2;
    lVar6 = lVar6 + 0x2b8;
  } while (lVar6 != -0xb0);
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}